

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O3

int vocready(voccxdef *ctx,char **cmd,int *typelist,int cur,objnum cmdActor,objnum cmdPrep,
            char *vverb,char *vprep,vocoldef *dolist,vocoldef *iolist,int *errp,char *cmdbuf,
            int first_word,uchar **preparse_list,int *next_start)

{
  int iVar1;
  char *pcVar2;
  char buf [128];
  
  iVar1 = 0;
  if (cur != -1) {
    if (((byte *)cmd[cur] == (byte *)0x0) || (iVar1 = 0, (byte)(*cmd[cur] | 2U) == 0x2e)) {
      if ((ctx->voccxflg & 4) != 0) {
        pcVar2 = "";
        if (vprep != (char *)0x0) {
          pcVar2 = vprep;
        }
        sprintf(buf,". executing verb:  %s %s\\n",vverb,pcVar2);
        outformat(buf);
      }
      iVar1 = execmd(ctx,cmdActor,cmdPrep,vverb,vprep,dolist,iolist,cmd + first_word,
                     typelist + first_word,cmdbuf,cur - first_word,preparse_list,next_start);
      *errp = iVar1;
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int vocready(voccxdef *ctx, char *cmd[], int *typelist, int cur,
                    objnum cmdActor, objnum cmdPrep, char *vverb, char *vprep,
                    vocoldef *dolist, vocoldef *iolist, int *errp,
                    char *cmdbuf, int first_word, uchar **preparse_list,
                    int *next_start)
{
    if (cur != -1
        && (cmd[cur] == (char *)0
            || vocspec(cmd[cur], VOCW_AND) || vocspec(cmd[cur], VOCW_THEN)))
    {
        if (ctx->voccxflg & VOCCXFDBG)
        {
            char buf[128];
            
            sprintf(buf, ". executing verb:  %s %s\\n",
                    vverb, vprep ? vprep : "");
            tioputs(ctx->vocxtio, buf);
        }

        *errp = execmd(ctx, cmdActor, cmdPrep, vverb, vprep, dolist, iolist,
                       &cmd[first_word], &typelist[first_word],cmdbuf,
                       cur - first_word, preparse_list, next_start);
        return(TRUE);
    }
    return(FALSE);
}